

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O1

ResponseLine * __thiscall
IRCDisconnectGenericCommand::trigger(IRCDisconnectGenericCommand *this,string_view parameters)

{
  ResponseLine *pRVar1;
  long lVar2;
  
  lVar2 = IRCCommand::selected_server;
  if ((IRCCommand::selected_server == 0) &&
     (lVar2 = IRCCommand::active_server, IRCCommand::active_server == 0)) {
    pRVar1 = (ResponseLine *)operator_new(0x30);
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar1,0x2b,"Error: No IRC server is currently selected.",2);
  }
  else {
    Jupiter::IRC::Client::disconnect(lVar2,0x18,"Disconnect command used.",1);
    pRVar1 = (ResponseLine *)operator_new(0x30);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar1,0x19,"Disconnected from server.",0);
  }
  return pRVar1;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *IRCDisconnectGenericCommand::trigger(std::string_view parameters)
{
	IRC_Bot *server;
	if (IRCCommand::selected_server != nullptr)
		server = IRCCommand::selected_server;
	else if (IRCCommand::active_server != nullptr)
		server = IRCCommand::active_server;
	else
		return new Jupiter::GenericCommand::ResponseLine("Error: No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicError);

	server->disconnect("Disconnect command used."sv, true);
	return new Jupiter::GenericCommand::ResponseLine("Disconnected from server."sv, GenericCommand::DisplayType::PublicSuccess);
}